

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::SetPrototypeAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *pRVar2;
  Var instance_00;
  RecyclableObject *newPrototype;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == SetPrototypeActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar1 = Js::JavascriptOperators::IsObject(instance);
      if (BVar1 != 0) {
        pRVar2 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
        }
        instance_00 = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 2));
        if (instance_00 != (Var)0x0) {
          BVar1 = Js::JavascriptOperators::IsObjectOrNull(instance_00);
          if (BVar1 != 0) {
            pRVar2 = Js::VarTo<Js::RecyclableObject>(instance_00);
            if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              instance_00 = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
            }
            pRVar2 = Js::VarTo<Js::RecyclableObject>(instance);
            newPrototype = Js::VarTo<Js::RecyclableObject>(instance_00);
            Js::JavascriptObject::ChangePrototype(pRVar2,newPrototype,true,scriptContext);
            return;
          }
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SetPrototypeAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::SetPrototypeActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var proto = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT_OR_NULL(proto, ctx);

            Js::JavascriptObject::ChangePrototype(Js::VarTo<Js::RecyclableObject>(var), Js::VarTo<Js::RecyclableObject>(proto), true, ctx);
        }